

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_ea566c::MiniscriptDescriptor::MiniscriptDescriptor
          (MiniscriptDescriptor *this,
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          *providers,NodeRef<uint32_t> *node)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long in_FS_OFFSET;
  allocator<char> local_59;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_58;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (providers->
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_58.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (providers->
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (providers->
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (providers->
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (providers->
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (providers->
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"?",&local_59);
  DescriptorImpl::DescriptorImpl(&this->super_DescriptorImpl,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_58);
  (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor =
       (_func_int **)&PTR__MiniscriptDescriptor_0063d990;
  (this->m_node).
  super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar1 = *(undefined4 *)
           &(node->
            super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  uVar2 = *(undefined4 *)
           ((long)&(node->
                   super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr + 4);
  uVar3 = *(undefined4 *)
           &(node->
            super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  uVar4 = *(undefined4 *)
           ((long)&(node->
                   super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_refcount._M_pi + 4);
  (node->super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   &(this->m_node).
    super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       uVar1;
  *(undefined4 *)
   ((long)&(this->m_node).
           super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 4) = uVar2;
  *(undefined4 *)
   &(this->m_node).
    super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = uVar3;
  *(undefined4 *)
   ((long)&(this->m_node).
           super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = uVar4;
  (node->super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

MiniscriptDescriptor(std::vector<std::unique_ptr<PubkeyProvider>> providers, miniscript::NodeRef<uint32_t> node)
        : DescriptorImpl(std::move(providers), "?"), m_node(std::move(node)) {}